

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::UnitTestImpl(UnitTestImpl *this,UnitTest *parent)

{
  pointer __p;
  TestEventListeners *this_00;
  TestEventListener *listener;
  DefaultPerThreadTestPartResultReporter *local_30 [3];
  UnitTest *local_18;
  UnitTest *parent_local;
  UnitTestImpl *this_local;
  
  this->_vptr_UnitTestImpl = (_func_int **)&PTR__UnitTestImpl_00179eb8;
  this->parent_ = parent;
  local_18 = parent;
  parent_local = (UnitTest *)this;
  FilePath::FilePath(&this->original_working_dir_);
  DefaultGlobalTestPartResultReporter::DefaultGlobalTestPartResultReporter
            (&this->default_global_test_part_result_reporter_,this);
  DefaultPerThreadTestPartResultReporter::DefaultPerThreadTestPartResultReporter
            (&this->default_per_thread_test_part_result_reporter_,this);
  this->global_test_part_result_repoter_ =
       &(this->default_global_test_part_result_reporter_).super_TestPartResultReporterInterface;
  Mutex::Mutex(&this->global_test_part_result_reporter_mutex_);
  local_30[0] = &this->default_per_thread_test_part_result_reporter_;
  ThreadLocal<testing::TestPartResultReporterInterface_*>::ThreadLocal
            (&this->per_thread_test_part_result_reporter_,
             (TestPartResultReporterInterface **)local_30);
  std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::vector
            (&this->environments_);
  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::vector
            (&this->test_suites_);
  std::vector<int,_std::allocator<int>_>::vector(&this->test_suite_indices_);
  ParameterizedTestSuiteRegistry::ParameterizedTestSuiteRegistry
            (&this->parameterized_test_registry_);
  TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteRegistry
            (&this->type_parameterized_test_registry_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignored_parameterized_test_suites_);
  this->parameterized_tests_registered_ = false;
  this->last_death_test_suite_ = -1;
  this->current_test_suite_ = (TestSuite *)0x0;
  this->current_test_info_ = (TestInfo *)0x0;
  TestResult::TestResult(&this->ad_hoc_test_result_);
  TestEventListeners::TestEventListeners(&this->listeners_);
  this->os_stack_trace_getter_ = (OsStackTraceGetterInterface *)0x0;
  this->post_flag_parse_init_performed_ = false;
  this->random_seed_ = 0;
  Random::Random(&this->random_,0);
  this->start_timestamp_ = 0;
  this->elapsed_time_ = 0;
  std::
  unique_ptr<testing::internal::InternalRunDeathTestFlag,std::default_delete<testing::internal::InternalRunDeathTestFlag>>
  ::unique_ptr<std::default_delete<testing::internal::InternalRunDeathTestFlag>,void>
            ((unique_ptr<testing::internal::InternalRunDeathTestFlag,std::default_delete<testing::internal::InternalRunDeathTestFlag>>
              *)&this->internal_run_death_test_flag_);
  __p = (pointer)operator_new(8);
  DefaultDeathTestFactory::DefaultDeathTestFactory((DefaultDeathTestFactory *)__p);
  std::
  unique_ptr<testing::internal::DeathTestFactory,std::default_delete<testing::internal::DeathTestFactory>>
  ::unique_ptr<std::default_delete<testing::internal::DeathTestFactory>,void>
            ((unique_ptr<testing::internal::DeathTestFactory,std::default_delete<testing::internal::DeathTestFactory>>
              *)&this->death_test_factory_,__p);
  ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
  ::ThreadLocal(&this->gtest_trace_stack_);
  this->catch_exceptions_ = false;
  this_00 = listeners(this);
  listener = (TestEventListener *)operator_new(8);
  PrettyUnitTestResultPrinter::PrettyUnitTestResultPrinter((PrettyUnitTestResultPrinter *)listener);
  TestEventListeners::SetDefaultResultPrinter(this_00,listener);
  return;
}

Assistant:

UnitTestImpl::UnitTestImpl(UnitTest* parent)
    : parent_(parent),
      GTEST_DISABLE_MSC_WARNINGS_PUSH_(4355 /* using this in initializer */)
          default_global_test_part_result_reporter_(this),
      default_per_thread_test_part_result_reporter_(this),
      GTEST_DISABLE_MSC_WARNINGS_POP_() global_test_part_result_repoter_(
          &default_global_test_part_result_reporter_),
      per_thread_test_part_result_reporter_(
          &default_per_thread_test_part_result_reporter_),
      parameterized_test_registry_(),
      parameterized_tests_registered_(false),
      last_death_test_suite_(-1),
      current_test_suite_(nullptr),
      current_test_info_(nullptr),
      ad_hoc_test_result_(),
      os_stack_trace_getter_(nullptr),
      post_flag_parse_init_performed_(false),
      random_seed_(0),  // Will be overridden by the flag before first use.
      random_(0),       // Will be reseeded before first use.
      start_timestamp_(0),
      elapsed_time_(0),
#if GTEST_HAS_DEATH_TEST
      death_test_factory_(new DefaultDeathTestFactory),
#endif
      // Will be overridden by the flag before first use.
      catch_exceptions_(false) {
  listeners()->SetDefaultResultPrinter(new PrettyUnitTestResultPrinter);
}